

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O0

void __thiscall
Json::Reader::addComment(Reader *this,Location begin,Location end,CommentPlacement placement)

{
  int in_ECX;
  long in_RDI;
  string *normalized;
  string *in_stack_ffffffffffffffa8;
  Value *in_stack_ffffffffffffffb0;
  string local_48 [24];
  Location in_stack_ffffffffffffffd0;
  Location in_stack_ffffffffffffffd8;
  
  if ((*(byte *)(in_RDI + 0x10c) & 1) == 0) {
    __assert_fail("collectComments_",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/lib_json/json_reader.cpp"
                  ,0x177,"void Json::Reader::addComment(Location, Location, CommentPlacement)");
  }
  normalizeEOL_abi_cxx11_(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  if (in_ECX == 1) {
    if (*(long *)(in_RDI + 0xe0) == 0) {
      __assert_fail("lastValue_ != 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/lib_json/json_reader.cpp"
                    ,0x17a,"void Json::Reader::addComment(Location, Location, CommentPlacement)");
    }
    Value::setComment(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
                      (CommentPlacement)((ulong)in_RDI >> 0x20));
  }
  else {
    std::__cxx11::string::operator+=((string *)(in_RDI + 0xe8),local_48);
  }
  std::__cxx11::string::~string(local_48);
  return;
}

Assistant:

void
Reader::addComment(Location begin, Location end, CommentPlacement placement) {
  assert(collectComments_);
  const std::string& normalized = normalizeEOL(begin, end);
  if (placement == commentAfterOnSameLine) {
    assert(lastValue_ != 0);
    lastValue_->setComment(normalized, placement);
  } else {
    commentsBefore_ += normalized;
  }
}